

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CMMParser.cpp
# Opt level: O3

bool __thiscall
cmm::CMMParser::parseConstantExpression
          (CMMParser *this,
          unique_ptr<cmm::ExpressionAST,_std::default_delete<cmm::ExpressionAST>_> *Res)

{
  anon_union_8_3_6d9870f7_for_CMMLexer_5 aVar1;
  int iVar2;
  pointer pcVar3;
  bool bVar4;
  Token TVar5;
  ExpressionAST *pEVar6;
  ExpressionAST *pEVar7;
  string local_38;
  
  switch((this->Lexer).CurTok.Kind) {
  case String:
    pEVar6 = (ExpressionAST *)operator_new(0x30);
    pEVar6->Kind = StringExpression;
    (pEVar6->super_AST)._vptr_AST = (_func_int **)&PTR__StringAST_00123930;
    pEVar6[1].super_AST._vptr_AST = (_func_int **)(pEVar6 + 2);
    pcVar3 = (this->Lexer).StrVal._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)(pEVar6 + 1),pcVar3,pcVar3 + (this->Lexer).StrVal._M_string_length);
    pEVar7 = (Res->_M_t).
             super___uniq_ptr_impl<cmm::ExpressionAST,_std::default_delete<cmm::ExpressionAST>_>.
             _M_t.
             super__Tuple_impl<0UL,_cmm::ExpressionAST_*,_std::default_delete<cmm::ExpressionAST>_>.
             super__Head_base<0UL,_cmm::ExpressionAST_*,_false>._M_head_impl;
    (Res->_M_t).super___uniq_ptr_impl<cmm::ExpressionAST,_std::default_delete<cmm::ExpressionAST>_>.
    _M_t.super__Tuple_impl<0UL,_cmm::ExpressionAST_*,_std::default_delete<cmm::ExpressionAST>_>.
    super__Head_base<0UL,_cmm::ExpressionAST_*,_false>._M_head_impl = pEVar6;
    goto LAB_00109fb7;
  default:
    local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_38,"unknown token in literal constant expression","");
    bVar4 = CMMLexer::Error(&this->Lexer,(this->Lexer).TokStartLoc,&local_38);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p == &local_38.field_2) {
      return bVar4;
    }
    operator_delete(local_38._M_dataplus._M_p);
    return bVar4;
  case Integer:
    pEVar6 = (ExpressionAST *)operator_new(0x10);
    iVar2 = (this->Lexer).field_4.IntVal;
    pEVar6->Kind = IntExpression;
    (pEVar6->super_AST)._vptr_AST = (_func_int **)&PTR__AST_00123870;
    *(int *)&pEVar6->field_0xc = iVar2;
    break;
  case Double:
    pEVar6 = (ExpressionAST *)operator_new(0x18);
    aVar1 = (this->Lexer).field_4;
    pEVar6->Kind = DoubleExpression;
    (pEVar6->super_AST)._vptr_AST = (_func_int **)&PTR__AST_001238b0;
    *(anon_union_8_3_6d9870f7_for_CMMLexer_5 *)(pEVar6 + 1) = aVar1;
    break;
  case Boolean:
    pEVar6 = (ExpressionAST *)operator_new(0x10);
    bVar4 = (this->Lexer).field_4.BoolVal;
    pEVar6->Kind = BoolExpression;
    (pEVar6->super_AST)._vptr_AST = (_func_int **)&PTR__AST_001238f0;
    pEVar6->field_0xc = bVar4;
  }
  pEVar7 = (Res->_M_t).
           super___uniq_ptr_impl<cmm::ExpressionAST,_std::default_delete<cmm::ExpressionAST>_>._M_t.
           super__Tuple_impl<0UL,_cmm::ExpressionAST_*,_std::default_delete<cmm::ExpressionAST>_>.
           super__Head_base<0UL,_cmm::ExpressionAST_*,_false>._M_head_impl;
  (Res->_M_t).super___uniq_ptr_impl<cmm::ExpressionAST,_std::default_delete<cmm::ExpressionAST>_>.
  _M_t.super__Tuple_impl<0UL,_cmm::ExpressionAST_*,_std::default_delete<cmm::ExpressionAST>_>.
  super__Head_base<0UL,_cmm::ExpressionAST_*,_false>._M_head_impl = pEVar6;
LAB_00109fb7:
  if (pEVar7 != (ExpressionAST *)0x0) {
    (*(pEVar7->super_AST)._vptr_AST[1])();
  }
  TVar5 = CMMLexer::LexToken(&this->Lexer);
  (this->Lexer).CurTok.Kind = TVar5.Kind;
  return false;
}

Assistant:

bool CMMParser::parseConstantExpression(std::unique_ptr<ExpressionAST> &Res) {
  switch (getKind()) {
  default:  return Error("unknown token in literal constant expression");
  case Token::Integer:  Res.reset(new IntAST(Lexer.getIntVal())); break;
  case Token::Double:   Res.reset(new DoubleAST(Lexer.getDoubleVal())); break;
  case Token::Boolean:  Res.reset(new BoolAST(Lexer.getBoolVal())); break;
  case Token::String:   Res.reset(new StringAST(Lexer.getStrVal())); break;
  }
  Lex(); // eat the string,bool,int,double.
  return false;
}